

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,CombinationalStmtBlock *param_1)

{
  unsigned_long local_10;
  
  local_10 = -0xe44323405ac1f4c << ((byte)(this->super_IRVisitor).level & 0x3f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,&local_10);
  return;
}

Assistant:

void visit(CombinationalStmtBlock*) override {
        constexpr uint64_t comb_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(comb_signature << level);
    }